

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O2

void __thiscall TaprootScriptTree_Branch2_Test::TestBody(TaprootScriptTree_Branch2_Test *this)

{
  pointer pBVar1;
  ScriptBuilder *this_00;
  ByteData256 *node;
  long lVar2;
  pointer pBVar3;
  char *pcVar4;
  char *in_R9;
  ulong uVar5;
  initializer_list<cfd::core::ByteData256> __l;
  bool parity;
  uint8_t leaf_version;
  Privkey sk;
  bool is_parity;
  SchnorrSignature sig;
  AssertionResult gtest_ar_5;
  ByteData256 msg;
  AssertHelper local_198;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  TaprootScriptTree tree;
  SchnorrPubkey schnorr_pubkey;
  Script script;
  SchnorrPubkey pk;
  Privkey key;
  Pubkey pubkey;
  AssertionResult gtest_ar__2;
  
  std::__cxx11::string::string
            ((string *)&tree,"dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8",
             (allocator *)&script);
  cfd::core::Privkey::Privkey(&key,(string *)&tree,kMainnet,true);
  std::__cxx11::string::~string((string *)&tree);
  cfd::core::Privkey::GeneratePubkey(&pubkey,&key,true);
  is_parity = false;
  cfd::core::SchnorrPubkey::FromPubkey(&schnorr_pubkey,&pubkey,&is_parity);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&tree,&schnorr_pubkey);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&script,
             "\"ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440\"",
             "schnorr_pubkey.GetHex()",
             (char (*) [65])"ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tree);
  std::__cxx11::string::~string((string *)&tree);
  if ((char)script._vptr_Script == '\0') {
    testing::Message::Message((Message *)&tree);
    if (script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)script.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x99,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sig,(Message *)&tree);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sig);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tree);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  script._vptr_Script._0_1_ = is_parity;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (is_parity == false) {
    testing::Message::Message((Message *)&sig);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&tree,(internal *)&script,(AssertionResult *)"is_parity","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sk,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0x9a,(char *)tree.super_TapBranch._vptr_TapBranch);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sk,(Message *)&sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sk);
    std::__cxx11::string::~string((string *)&tree);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  tree.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__ScriptBuilder_005ba258;
  tree.super_TapBranch.has_leaf_ = false;
  tree.super_TapBranch.leaf_version_ = '\0';
  tree.super_TapBranch._10_6_ = 0;
  tree.super_TapBranch.script_._vptr_Script = (_func_int **)0x0;
  tree.super_TapBranch.script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  this_00 = cfd::core::ScriptBuilder::operator<<
                      ((ScriptBuilder *)&tree,(ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE);
  cfd::core::ScriptBuilder::Build(&script,this_00);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&tree);
  leaf_version = 0xc4;
  std::__cxx11::string::string
            ((string *)&sig,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)&gtest_ar_5);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&tree,(string *)&sig);
  std::__cxx11::string::string
            ((string *)&sk,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57",
             (allocator *)&msg);
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)&tree.super_TapBranch.script_.script_data_,(string *)&sk);
  __l._M_len = 2;
  __l._M_array = (iterator)&tree;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (&nodes,__l,(allocator_type *)&pk);
  lVar2 = 0x18;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&tree.super_TapBranch._vptr_TapBranch + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  std::__cxx11::string::~string((string *)&sk);
  std::__cxx11::string::~string((string *)&sig);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,leaf_version,&script);
  pBVar1 = nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pBVar3 = nodes.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_start; pBVar3 != pBVar1; pBVar3 = pBVar3 + 1) {
    cfd::core::TaprootScriptTree::AddBranch(&tree,pBVar3);
  }
  sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       cfd::core::TapBranch::GetLeafVersion(&tree.super_TapBranch);
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            ((internal *)&sig,"leaf_version","tree.GetLeafVersion()",&leaf_version,(uchar *)&sk);
  if ((char)sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&sk);
    if (sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)sig.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xa7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&sk);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sk);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&sk,&script);
  cfd::core::TapBranch::GetScript((Script *)&sig,&tree.super_TapBranch);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_5,(Script *)&sig);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&msg,"script.GetHex()","tree.GetScript().GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sk,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_5);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  cfd::core::Script::~Script((Script *)&sig);
  std::__cxx11::string::~string((string *)&sk);
  if ((char)msg.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&sig);
    if (msg.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)msg.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sk,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xa8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sk,(Message *)&sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sk);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&msg.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  gtest_ar_5._0_8_ =
       ((long)nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_finish -
       (long)nodes.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_start) / 0x18;
  cfd::core::TaprootScriptTree::GetNodeList
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&sig,&tree);
  msg.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(((long)sig.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 CONCAT71(sig.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._1_7_,
                          (char)sig.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start)) / 0x18);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&sk,"nodes.size()","tree.GetNodeList().size()",(unsigned_long *)&gtest_ar_5
             ,(unsigned_long *)&msg);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&sig);
  if ((uint8_t)sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&sig);
    if (sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)sk.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xa9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  pBVar3 = nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar1 = nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cfd::core::TaprootScriptTree::GetNodeList
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&sig,&tree);
  lVar2 = CONCAT71(sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                   (char)sig.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&sig);
  if ((long)pBVar3 - (long)pBVar1 ==
      (long)sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish - lVar2) {
    lVar2 = 0;
    uVar5 = 0;
    while( true ) {
      if ((ulong)(((long)nodes.
                         super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)nodes.
                        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar5) break;
      cfd::core::ByteData256::GetHex_abi_cxx11_
                ((string *)&sig,
                 (ByteData256 *)
                 ((long)&((nodes.
                           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                           ._M_impl.super__Vector_impl_data._M_start)->data_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar2));
      cfd::core::TaprootScriptTree::GetNodeList
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &gtest_ar_5,&tree);
      cfd::core::ByteData256::GetHex_abi_cxx11_
                ((string *)&sk,(ByteData256 *)(gtest_ar_5._0_8_ + lVar2));
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&msg,"nodes[index].GetHex()","tree.GetNodeList()[index].GetHex()",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig,
                 (string *)&sk);
      std::__cxx11::string::~string((string *)&sk);
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &gtest_ar_5);
      std::__cxx11::string::~string((string *)&sig);
      if ((char)msg.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == '\0') {
        testing::Message::Message((Message *)&sig);
        pcVar4 = "";
        if (msg.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          pcVar4 = *(char **)msg.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&sk,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
                   ,0xac,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&sk,(Message *)&sig);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sk);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&sig);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&msg.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
      uVar5 = uVar5 + 1;
      lVar2 = lVar2 + 0x18;
    }
  }
  parity = false;
  cfd::core::TaprootScriptTree::GetTapLeafHash((ByteData256 *)&sk,&tree);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&sig,(ByteData256 *)&sk);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&gtest_ar_5,
             "\"b893df7b9b277874f3427de6af5a8d9b1ba5ba6be139557d7a1db9cc4a4e5dae\"",
             "tree.GetTapLeafHash().GetHex()",
             (char (*) [65])"b893df7b9b277874f3427de6af5a8d9b1ba5ba6be139557d7a1db9cc4a4e5dae",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig);
  std::__cxx11::string::~string((string *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&sig);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sk,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xb1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sk,(Message *)&sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sk);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  cfd::core::TapBranch::GetCurrentBranchHash((ByteData256 *)&sk,&tree.super_TapBranch);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&sig,(ByteData256 *)&sk);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&gtest_ar_5,
             "\"dc650bb6e95f7ee50dfbddf68651f77cd78c68f8f6c0c64014e5ef7c829c3635\"",
             "tree.GetCurrentBranchHash().GetHex()",
             (char (*) [65])"dc650bb6e95f7ee50dfbddf68651f77cd78c68f8f6c0c64014e5ef7c829c3635",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig);
  std::__cxx11::string::~string((string *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&sig);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sk,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xb3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sk,(Message *)&sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sk);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  cfd::core::TapBranch::GetTweakedPubkey
            ((SchnorrPubkey *)&sk,&tree.super_TapBranch,&schnorr_pubkey,(bool *)0x0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&sig,(SchnorrPubkey *)&sk);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&gtest_ar_5,
             "\"300af27b4b5d270ec1ccc147210af5904724ef72d3ead21c569564a1536d33a3\"",
             "tree.GetTweakedPubkey(schnorr_pubkey).GetHex()",
             (char (*) [65])"300af27b4b5d270ec1ccc147210af5904724ef72d3ead21c569564a1536d33a3",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig);
  std::__cxx11::string::~string((string *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&sig);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sk,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xb5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sk,(Message *)&sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sk);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  cfd::core::TapBranch::GetTweakedPrivkey(&sk,&tree.super_TapBranch,&key,&parity);
  cfd::core::Privkey::GetHex_abi_cxx11_((string *)&sig,&sk);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&gtest_ar_5,
             "\"7801a8819654c6c31f5a7cbd152f881a138e2adfc64da9dc1f78fbf80640f53a\"",
             "tree.GetTweakedPrivkey(key, &parity).GetHex()",
             (char (*) [65])"7801a8819654c6c31f5a7cbd152f881a138e2adfc64da9dc1f78fbf80640f53a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig);
  std::__cxx11::string::~string((string *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&sig);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sk,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xb7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sk,(Message *)&sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sk);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = parity;
  sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (parity == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sig,(internal *)&sk,(AssertionResult *)0x40e528,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xb8,(char *)CONCAT71(sig.data_.data_.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                      (char)sig.data_.data_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start));
    testing::internal::AssertHelper::operator=((AssertHelper *)&msg,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&msg);
    std::__cxx11::string::~string((string *)&sig);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::string
            ((string *)&sig,"e5b11ddceab1e4fc49a8132ae589a39b07acf49cabb2b0fbf6104bc31da12c02",
             (allocator *)&sk);
  cfd::core::ByteData256::ByteData256(&msg,(string *)&sig);
  std::__cxx11::string::~string((string *)&sig);
  cfd::core::TapBranch::GetTweakedPubkey(&pk,&tree.super_TapBranch,&schnorr_pubkey,(bool *)0x0);
  cfd::core::TapBranch::GetTweakedPrivkey(&sk,&tree.super_TapBranch,&key,(bool *)0x0);
  cfd::core::SchnorrUtil::Sign(&sig,&msg,&sk);
  gtest_ar__2.success_ = cfd::core::SchnorrPubkey::Verify(&pk,&sig,&msg);
  gtest_ar__2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__2.success_) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5,(internal *)&gtest_ar__2,
               (AssertionResult *)"pk.Verify(sig, msg)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_merkletree.cpp"
               ,0xbe,(char *)gtest_ar_5._0_8_);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    std::__cxx11::string::~string((string *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_190);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__2.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&msg);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&nodes);
  cfd::core::Script::~Script(&script);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  return;
}

Assistant:

TEST(TaprootScriptTree, Branch2) {
  Privkey key("dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  Script script = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  uint8_t leaf_version = 0xc4;
  std::vector<ByteData256> nodes = {
    ByteData256("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
    ByteData256("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57")
  };
  TaprootScriptTree tree(leaf_version, script);
  for (const auto& node : nodes) {
    tree.AddBranch(node);
  }

  EXPECT_EQ(leaf_version, tree.GetLeafVersion());
  EXPECT_EQ(script.GetHex(), tree.GetScript().GetHex());
  EXPECT_EQ(nodes.size(), tree.GetNodeList().size());
  if (nodes.size() == tree.GetNodeList().size()) {
    for (size_t index=0; index<nodes.size(); ++index) {
      EXPECT_EQ(nodes[index].GetHex(), tree.GetNodeList()[index].GetHex());
    }
  }
  bool parity = false;
  EXPECT_EQ("b893df7b9b277874f3427de6af5a8d9b1ba5ba6be139557d7a1db9cc4a4e5dae",
      tree.GetTapLeafHash().GetHex());
  EXPECT_EQ("dc650bb6e95f7ee50dfbddf68651f77cd78c68f8f6c0c64014e5ef7c829c3635",
      tree.GetCurrentBranchHash().GetHex());
  EXPECT_EQ("300af27b4b5d270ec1ccc147210af5904724ef72d3ead21c569564a1536d33a3",
      tree.GetTweakedPubkey(schnorr_pubkey).GetHex());
  EXPECT_EQ("7801a8819654c6c31f5a7cbd152f881a138e2adfc64da9dc1f78fbf80640f53a",
      tree.GetTweakedPrivkey(key, &parity).GetHex());
  EXPECT_TRUE(parity);

  ByteData256 msg("e5b11ddceab1e4fc49a8132ae589a39b07acf49cabb2b0fbf6104bc31da12c02");
  auto pk = tree.GetTweakedPubkey(schnorr_pubkey);
  auto sk = tree.GetTweakedPrivkey(key);
  auto sig = SchnorrUtil::Sign(msg, sk);
  EXPECT_TRUE(pk.Verify(sig, msg));
}